

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

int __thiscall glslang::TPpContext::tTokenInput::scan(tTokenInput *this,TPpToken *ppToken)

{
  TokenStream *pTVar1;
  int iVar2;
  int atom;
  MacroSymbol *pMVar3;
  
  iVar2 = TokenStream::getToken(this->tokens,((this->super_tInput).pp)->parseContext,ppToken);
  ppToken->fullyExpanded = this->preExpanded;
  pTVar1 = this->tokens;
  if ((iVar2 == 0xa2) &&
     ((ulong)(((long)(pTVar1->stream).
                     super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                     .
                     super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pTVar1->stream).
                    super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    .
                    super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= pTVar1->currentPos)) {
    atom = TStringAtomMap::getAtom(&((this->super_tInput).pp)->atomStrings,ppToken->name);
    if (atom != 0) {
      pMVar3 = lookupMacroDef((this->super_tInput).pp,atom);
      if ((pMVar3 != (MacroSymbol *)0x0) && ((pMVar3->field_0x48 & 1) != 0)) {
        ppToken->fullyExpanded = false;
      }
    }
  }
  return iVar2;
}

Assistant:

virtual int scan(TPpToken *ppToken) override {
            int token = tokens->getToken(pp->parseContext, ppToken);
            ppToken->fullyExpanded = preExpanded;
            if (tokens->atEnd() && token == PpAtomIdentifier) {
                int macroAtom = pp->atomStrings.getAtom(ppToken->name);
                MacroSymbol* macro = macroAtom == 0 ? nullptr : pp->lookupMacroDef(macroAtom);
                if (macro && macro->functionLike)
                    ppToken->fullyExpanded = false;
            }
            return token;
        }